

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  undefined1 local_5818 [8];
  char dest [22465];
  char *src;
  void *p;
  size_t len;
  longlong t;
  timespec end;
  timespec start;
  int i;
  
  src = (char *)0x0;
  stack0xffffffffffffffb0 = (char *)0x0;
  memcpy(local_5818,&DAT_00102010,0x57c1);
  stack0xffffffffffffffb0 = "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjj";
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (start.tv_nsec._0_4_ = 0; (int)start.tv_nsec < 1000000;
      start.tv_nsec._0_4_ = (int)start.tv_nsec + 1) {
    my_memcpy(local_5818,stack0xffffffffffffffb0,0x35);
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (start.tv_nsec._0_4_ = 0; (int)start.tv_nsec < 1000000;
      start.tv_nsec._0_4_ = (int)start.tv_nsec + 1) {
    my_memcpy2(local_5818,stack0xffffffffffffffb0,0x35);
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, memcmp+memcpy:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (start.tv_nsec._0_4_ = 0; (int)start.tv_nsec < 1000000;
      start.tv_nsec._0_4_ = (int)start.tv_nsec + 1) {
    src = (char *)my_memset(src,stack0xffffffffffffffb0,0x35);
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, realloc+memcpy:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  printf("\n");
  stack0xffffffffffffffb0 =
       "jjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;l"
  ;
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (start.tv_nsec._0_4_ = 0; (int)start.tv_nsec < 1000000;
      start.tv_nsec._0_4_ = (int)start.tv_nsec + 1) {
    my_memcpy(local_5818,stack0xffffffffffffffb0,0x1a1);
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (start.tv_nsec._0_4_ = 0; (int)start.tv_nsec < 1000000;
      start.tv_nsec._0_4_ = (int)start.tv_nsec + 1) {
    my_memcpy2(local_5818,stack0xffffffffffffffb0,0x1a1);
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, memcmp+memcpy:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (start.tv_nsec._0_4_ = 0; (int)start.tv_nsec < 1000000;
      start.tv_nsec._0_4_ = (int)start.tv_nsec + 1) {
    src = (char *)my_memset(src,stack0xffffffffffffffb0,0x1a1);
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, realloc+memcpy:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  printf("\n");
  stack0xffffffffffffffb0 =
       "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;al..." /* TRUNCATED STRING LITERAL */
  ;
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (start.tv_nsec._0_4_ = 0; (int)start.tv_nsec < 1000000;
      start.tv_nsec._0_4_ = (int)start.tv_nsec + 1) {
    my_memcpy(local_5818,stack0xffffffffffffffb0,0x57c1);
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (start.tv_nsec._0_4_ = 0; (int)start.tv_nsec < 1000000;
      start.tv_nsec._0_4_ = (int)start.tv_nsec + 1) {
    my_memcpy2(local_5818,stack0xffffffffffffffb0,0x57c1);
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, memcmp+memcpy:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  clock_gettime(1,(timespec *)&end.tv_nsec);
  for (start.tv_nsec._0_4_ = 0; (int)start.tv_nsec < 1000000;
      start.tv_nsec._0_4_ = (int)start.tv_nsec + 1) {
    src = (char *)my_memset(src,stack0xffffffffffffffb0,0x57c1);
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, realloc+memcpy:\n\t %lld\n","main",
         ((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec);
  printf("\n");
  return 0;
}

Assistant:

int
main()
{
    int i;
    struct timespec start, end;
    long long t;
    size_t len;
    void *p = NULL;
    char *src = NULL;
    char dest[] = BUFF3;
    src = BUFF1;
    len = strlen(BUFF1) + 1;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy2(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcmp+memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        p = my_memset(p, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc+memcpy:\n\t %lld\n", __func__, t);
    printf("\n");

    src = BUFF2;
    len = strlen(BUFF2) + 1;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy2(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcmp+memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        p = my_memset(p, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc+memcpy:\n\t %lld\n", __func__, t);
    printf("\n");

    src = BUFF3;
    len = strlen(BUFF3) + 1;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy2(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcmp+memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        p = my_memset(p, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc+memcpy:\n\t %lld\n", __func__, t);
    printf("\n");

    return 0;
}